

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_delete(char *_fname)

{
  undefined1 *ptr;
  char *_fname_00;
  size_t sVar1;
  ulong len_00;
  char *fname_00;
  undefined1 *puVar2;
  undefined1 auStack_48 [8];
  undefined1 *local_40;
  size_t local_38;
  ulong local_30;
  size_t len;
  char *fname;
  char *pcStack_18;
  int retval;
  char *_fname_local;
  
  puVar2 = auStack_48;
  pcStack_18 = _fname;
  __PHYSFS_platformGrabMutex(stateLock);
  if (writeDir == (DirHandle *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_NO_WRITE_DIR);
    __PHYSFS_platformReleaseMutex(stateLock);
    _fname_local._4_4_ = 0;
  }
  else {
    local_38 = strlen(pcStack_18);
    sVar1 = dirHandleRootLen(writeDir);
    len_00 = local_38 + sVar1 + 1;
    if (len_00 < 0x100) {
      puVar2 = auStack_48 + -(local_38 + sVar1 + 0x18 & 0xfffffffffffffff0);
      local_40 = puVar2;
    }
    else {
      local_40 = (undefined1 *)0x0;
    }
    ptr = local_40;
    local_30 = len_00;
    *(undefined8 *)(puVar2 + -8) = 0x109cab;
    fname_00 = (char *)__PHYSFS_initSmallAlloc(ptr,len_00);
    _fname_00 = pcStack_18;
    len = (size_t)fname_00;
    if (fname_00 == (char *)0x0) {
      *(undefined8 *)(puVar2 + -8) = 0x109cc0;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      *(undefined8 *)(puVar2 + -8) = 0x109ccc;
      __PHYSFS_platformReleaseMutex(stateLock);
      _fname_local._4_4_ = 0;
    }
    else {
      *(undefined8 *)(puVar2 + -8) = 0x109ce4;
      fname._4_4_ = doDelete(_fname_00,fname_00);
      *(undefined8 *)(puVar2 + -8) = 0x109cf3;
      __PHYSFS_platformReleaseMutex(stateLock);
      sVar1 = len;
      *(undefined8 *)(puVar2 + -8) = 0x109cfc;
      __PHYSFS_smallFree((void *)sVar1);
      _fname_local._4_4_ = fname._4_4_;
    }
  }
  return _fname_local._4_4_;
}

Assistant:

int PHYSFS_delete(const char *_fname)
{
    int retval;
    char *fname;
    size_t len;

    __PHYSFS_platformGrabMutex(stateLock);
    BAIL_IF_MUTEX(!writeDir, PHYSFS_ERR_NO_WRITE_DIR, stateLock, 0);
    len = strlen(_fname) + dirHandleRootLen(writeDir) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    retval = doDelete(_fname, fname);
    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(fname);
    return retval;
}